

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::AddIfExists(cmCTest *this,Part part,string *file)

{
  bool bVar1;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string name;
  string *file_local;
  Part part_local;
  cmCTest *this_local;
  
  name.field_2._8_8_ = file;
  bVar1 = CTestFileExists(this,file);
  if (bVar1) {
    AddSubmitFile(this,part,(string *)name.field_2._8_8_);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_78,(string *)name.field_2._8_8_);
    cmAlphaNum::cmAlphaNum(&local_a8,".gz");
    cmStrCat<>((string *)local_48,&local_78,&local_a8);
    bVar1 = CTestFileExists(this,(string *)local_48);
    if (bVar1) {
      AddSubmitFile(this,part,(string *)name.field_2._8_8_);
    }
    else {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (!bVar1) goto LAB_001bcb16;
  }
  this_local._7_1_ = 1;
LAB_001bcb16:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTest::AddIfExists(Part part, const std::string& file)
{
  if (this->CTestFileExists(file)) {
    this->AddSubmitFile(part, file);
  } else {
    std::string name = cmStrCat(file, ".gz");
    if (this->CTestFileExists(name)) {
      this->AddSubmitFile(part, file);
    } else {
      return false;
    }
  }
  return true;
}